

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plp.cc
# Opt level: O0

int main(int argc,char **argv)

{
  vector<double,_std::allocator<double>_> *pvVar1;
  bool bVar2;
  byte bVar3;
  ostream *poVar4;
  ostream *poVar5;
  long in_RSI;
  int in_EDI;
  ostringstream error_message_24;
  ostringstream error_message_23;
  ostringstream error_message_22;
  ostringstream error_message_21;
  ostringstream error_message_20;
  ostringstream error_message_19;
  double energy;
  vector<double,_std::allocator<double>_> output;
  vector<double,_std::allocator<double>_> processed_input;
  vector<double,_std::allocator<double>_> input;
  int output_length;
  int input_length;
  ostringstream error_message_18;
  Buffer buffer_for_plp_analysis;
  PerceptualLinearPredictiveCoefficientsAnalysis analysis;
  ostringstream error_message_17;
  Buffer buffer_for_spectral_analysis;
  WaveformToSpectrum waveform_to_spectrum;
  ostringstream error_message_16;
  SpectrumToSpectrum spectrum_to_spectrum;
  istream *input_stream;
  ostringstream error_message_15;
  ifstream ifs;
  ostringstream error_message_14;
  char *input_file;
  ostringstream error_message_13;
  int num_input_files;
  ostringstream error_message_12;
  ostringstream error_message_11;
  double sampling_rate_in_hz;
  ostringstream error_message_10;
  ostringstream error_message_9;
  int tmp_1;
  int max_1;
  int min_1;
  ostringstream error_message_8;
  int tmp;
  int max;
  int min;
  ostringstream error_message_7;
  ostringstream error_message_6;
  ostringstream error_message_5;
  ostringstream error_message_4;
  ostringstream error_message_3;
  ostringstream error_message_2;
  ostringstream error_message_1;
  ostringstream error_message;
  int option_char;
  double floor;
  OutputFormats output_format;
  InputFormats input_format;
  bool is_highest_frequency_specified;
  double highest_frequency;
  double lowest_frequency;
  double sampling_rate;
  double compression_factor;
  int liftering_coefficient;
  int fft_length;
  int num_order;
  int num_channel;
  option *in_stack_ffffffffffffcb78;
  Buffer *buffer;
  PerceptualLinearPredictiveCoefficientsAnalysis *in_stack_ffffffffffffcb80;
  undefined7 in_stack_ffffffffffffcb88;
  undefined1 in_stack_ffffffffffffcb8f;
  WaveformToSpectrum *in_stack_ffffffffffffcb90;
  undefined7 in_stack_ffffffffffffcb98;
  undefined1 in_stack_ffffffffffffcb9f;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffcba0;
  allocator *paVar6;
  int *in_stack_ffffffffffffcbb0;
  undefined7 in_stack_ffffffffffffcbb8;
  undefined1 in_stack_ffffffffffffcbbf;
  Buffer *in_stack_ffffffffffffcbc0;
  SpectrumToSpectrum *in_stack_ffffffffffffcbc8;
  int in_stack_ffffffffffffcbd0;
  undefined2 in_stack_ffffffffffffcbd4;
  undefined1 in_stack_ffffffffffffcbd6;
  undefined1 in_stack_ffffffffffffcbd7;
  undefined6 in_stack_ffffffffffffcbe0;
  undefined1 in_stack_ffffffffffffcbe6;
  undefined1 in_stack_ffffffffffffcbe7;
  ostream *in_stack_ffffffffffffcc00;
  int local_33e4;
  double in_stack_ffffffffffffcc20;
  undefined7 in_stack_ffffffffffffcc28;
  undefined1 in_stack_ffffffffffffcc2f;
  undefined8 in_stack_ffffffffffffcc30;
  InputOutputFormats output_format_00;
  InputOutputFormats in_stack_ffffffffffffcc38;
  int in_stack_ffffffffffffcc3c;
  SpectrumToSpectrum *in_stack_ffffffffffffcc40;
  undefined7 in_stack_ffffffffffffcc48;
  undefined1 in_stack_ffffffffffffcc4f;
  char *pcVar7;
  undefined7 in_stack_ffffffffffffcc58;
  undefined8 in_stack_ffffffffffffcc60;
  undefined8 in_stack_ffffffffffffcc68;
  undefined7 in_stack_ffffffffffffcc70;
  byte in_stack_ffffffffffffcc77;
  Buffer *in_stack_ffffffffffffcc88;
  double *in_stack_ffffffffffffcc90;
  ostringstream *poVar8;
  vector<double,_std::allocator<double>_> *plp;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffcca0;
  PerceptualLinearPredictiveCoefficientsAnalysis *in_stack_ffffffffffffcca8;
  bool local_331a;
  byte local_32d2;
  ostringstream *in_stack_ffffffffffffcd68;
  undefined4 in_stack_ffffffffffffcd70;
  byte in_stack_ffffffffffffcd74;
  undefined1 in_stack_ffffffffffffcd75;
  byte in_stack_ffffffffffffcd76;
  undefined1 in_stack_ffffffffffffcd77;
  bool local_3262;
  bool local_3232;
  bool local_320a;
  bool local_31e2;
  bool local_31ba;
  bool local_316a;
  bool local_3142;
  undefined1 local_3121 [33];
  ostringstream local_3100 [383];
  undefined1 local_2f81 [33];
  ostringstream local_2f60 [383];
  allocator local_2de1;
  string local_2de0 [32];
  ostringstream local_2dc0 [383];
  allocator local_2c41;
  string local_2c40 [32];
  ostringstream local_2c20 [383];
  allocator local_2aa1;
  string local_2aa0 [32];
  ostringstream local_2a80 [383];
  allocator local_2901;
  string local_2900 [32];
  ostringstream local_28e0 [376];
  undefined1 local_2768 [120];
  string local_26f0 [32];
  ostringstream local_26d0 [584];
  PerceptualLinearPredictiveCoefficientsAnalysis local_2488;
  allocator local_2389;
  string local_2388 [32];
  ostringstream local_2368 [815];
  allocator local_2039;
  string local_2038 [32];
  ostringstream local_2018 [376];
  SpectrumToSpectrum local_1ea0;
  char *local_1e58;
  undefined4 local_1e50;
  allocator local_1e49;
  string local_1e48 [32];
  ostringstream local_1e28 [376];
  char local_1cb0 [527];
  allocator local_1aa1;
  string local_1aa0 [32];
  ostringstream local_1a80 [376];
  vector<double,_std::allocator<double>_> *local_1908;
  allocator local_18f9;
  string local_18f8 [32];
  ostringstream local_18d8 [376];
  int local_1760;
  allocator local_1759;
  string local_1758 [32];
  ostringstream local_1738 [383];
  allocator local_15b9;
  string local_15b8 [32];
  ostringstream local_1598 [376];
  double local_1420;
  allocator local_1411;
  string local_1410 [32];
  ostringstream local_13f0 [383];
  allocator local_1271;
  string local_1270 [39];
  allocator local_1249;
  string local_1248 [32];
  ostringstream local_1228 [383];
  allocator local_10a9;
  string local_10a8 [32];
  int local_1088;
  undefined4 local_1084;
  undefined4 local_1080;
  allocator local_1079;
  string local_1078 [32];
  ostringstream local_1058 [383];
  allocator local_ed9;
  string local_ed8 [32];
  int local_eb8;
  undefined4 local_eb4;
  undefined4 local_eb0;
  allocator local_ea9;
  string local_ea8 [32];
  ostringstream local_e88 [383];
  allocator local_d09;
  string local_d08 [39];
  allocator local_ce1;
  string local_ce0 [32];
  ostringstream local_cc0 [383];
  allocator local_b41;
  string local_b40 [39];
  allocator local_b19;
  string local_b18 [32];
  ostringstream local_af8 [383];
  allocator local_979;
  string local_978 [39];
  allocator local_951;
  string local_950 [32];
  ostringstream local_930 [383];
  allocator local_7b1;
  string local_7b0 [39];
  allocator local_789;
  string local_788 [32];
  ostringstream local_768 [383];
  allocator local_5e9;
  string local_5e8 [39];
  allocator local_5c1;
  string local_5c0 [32];
  ostringstream local_5a0 [383];
  allocator local_421;
  string local_420 [39];
  allocator local_3f9;
  string local_3f8 [32];
  ostringstream local_3d8 [383];
  allocator local_259;
  string local_258 [39];
  allocator local_231;
  string local_230 [32];
  ostringstream local_210 [399];
  allocator local_81;
  string local_80 [36];
  int local_5c;
  double local_58;
  int local_4c;
  int local_48;
  byte local_41;
  double local_40;
  double local_38;
  double local_30;
  double local_28;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  long local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_14 = 0x14;
  local_18 = 0xc;
  local_1c = 0x100;
  local_20 = 0x16;
  local_28 = 0.33;
  local_30 = 16.0;
  local_38 = 0.0;
  local_40 = 0.0;
  local_41 = 0;
  local_48 = 4;
  local_4c = 0;
  local_58 = 1.0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  while( true ) {
    local_5c = ya_getopt_long((int)((ulong)in_stack_ffffffffffffcb90 >> 0x20),
                              (char **)CONCAT17(in_stack_ffffffffffffcb8f,in_stack_ffffffffffffcb88)
                              ,(char *)in_stack_ffffffffffffcb80,in_stack_ffffffffffffcb78,
                              (int *)0x104a79);
    pcVar7 = ya_optarg;
    output_format_00 = (InputOutputFormats)((ulong)in_stack_ffffffffffffcc30 >> 0x20);
    if (local_5c == -1) break;
    switch(local_5c) {
    case 0x48:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_d08,pcVar7,&local_d09);
      bVar2 = sptk::ConvertStringToDouble
                        ((string *)CONCAT17(in_stack_ffffffffffffcb8f,in_stack_ffffffffffffcb88),
                         (double *)in_stack_ffffffffffffcb80);
      local_3262 = !bVar2 || local_40 <= 0.0;
      std::__cxx11::string::~string(local_d08);
      std::allocator<char>::~allocator((allocator<char> *)&local_d09);
      if (local_3262) {
        std::__cxx11::ostringstream::ostringstream(local_e88);
        std::operator<<((ostream *)local_e88,
                        "The argument for the -H option must be a positive number");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_ea8,"plp",&local_ea9);
        sptk::PrintErrorMessage
                  ((string *)
                   CONCAT17(in_stack_ffffffffffffcd77,
                            CONCAT16(in_stack_ffffffffffffcd76,
                                     CONCAT15(in_stack_ffffffffffffcd75,
                                              CONCAT14(in_stack_ffffffffffffcd74,
                                                       in_stack_ffffffffffffcd70)))),
                   in_stack_ffffffffffffcd68);
        std::__cxx11::string::~string(local_ea8);
        std::allocator<char>::~allocator((allocator<char> *)&local_ea9);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_e88);
        return local_4;
      }
      local_41 = 1;
      break;
    default:
      anon_unknown.dwarf_18e8::PrintUsage(in_stack_ffffffffffffcc00);
      return 1;
    case 0x4c:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b40,pcVar7,&local_b41);
      bVar2 = sptk::ConvertStringToDouble
                        ((string *)CONCAT17(in_stack_ffffffffffffcb8f,in_stack_ffffffffffffcb88),
                         (double *)in_stack_ffffffffffffcb80);
      local_3232 = !bVar2 || local_38 < 0.0;
      std::__cxx11::string::~string(local_b40);
      std::allocator<char>::~allocator((allocator<char> *)&local_b41);
      if (local_3232) {
        std::__cxx11::ostringstream::ostringstream(local_cc0);
        poVar5 = std::operator<<((ostream *)local_cc0,"The argument for the -L option must be a ");
        std::operator<<(poVar5,"non-negative number");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_ce0,"plp",&local_ce1);
        sptk::PrintErrorMessage
                  ((string *)
                   CONCAT17(in_stack_ffffffffffffcd77,
                            CONCAT16(in_stack_ffffffffffffcd76,
                                     CONCAT15(in_stack_ffffffffffffcd75,
                                              CONCAT14(in_stack_ffffffffffffcd74,
                                                       in_stack_ffffffffffffcd70)))),
                   in_stack_ffffffffffffcd68);
        std::__cxx11::string::~string(local_ce0);
        std::allocator<char>::~allocator((allocator<char> *)&local_ce1);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_cc0);
        return local_4;
      }
      break;
    case 99:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_5e8,pcVar7,&local_5e9);
      bVar2 = sptk::ConvertStringToInteger
                        ((string *)CONCAT17(in_stack_ffffffffffffcb8f,in_stack_ffffffffffffcb88),
                         (int *)in_stack_ffffffffffffcb80);
      local_31ba = !bVar2 || local_20 < 1;
      std::__cxx11::string::~string(local_5e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_5e9);
      if (local_31ba) {
        std::__cxx11::ostringstream::ostringstream(local_768);
        std::operator<<((ostream *)local_768,
                        "The argument for the -c option must be a positive integer");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_788,"plp",&local_789);
        sptk::PrintErrorMessage
                  ((string *)
                   CONCAT17(in_stack_ffffffffffffcd77,
                            CONCAT16(in_stack_ffffffffffffcd76,
                                     CONCAT15(in_stack_ffffffffffffcd75,
                                              CONCAT14(in_stack_ffffffffffffcd74,
                                                       in_stack_ffffffffffffcd70)))),
                   in_stack_ffffffffffffcd68);
        std::__cxx11::string::~string(local_788);
        std::allocator<char>::~allocator((allocator<char> *)&local_789);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_768);
        return local_4;
      }
      break;
    case 0x65:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1270,pcVar7,&local_1271);
      bVar2 = sptk::ConvertStringToDouble
                        ((string *)CONCAT17(in_stack_ffffffffffffcb8f,in_stack_ffffffffffffcb88),
                         (double *)in_stack_ffffffffffffcb80);
      local_331a = !bVar2 || local_58 <= 0.0;
      std::__cxx11::string::~string(local_1270);
      std::allocator<char>::~allocator((allocator<char> *)&local_1271);
      if (local_331a) {
        std::__cxx11::ostringstream::ostringstream(local_13f0);
        std::operator<<((ostream *)local_13f0,
                        "The argument for the -e option must be a positive number");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1410,"plp",&local_1411);
        sptk::PrintErrorMessage
                  ((string *)
                   CONCAT17(in_stack_ffffffffffffcd77,
                            CONCAT16(in_stack_ffffffffffffcd76,
                                     CONCAT15(in_stack_ffffffffffffcd75,
                                              CONCAT14(in_stack_ffffffffffffcd74,
                                                       in_stack_ffffffffffffcd70)))),
                   in_stack_ffffffffffffcd68);
        std::__cxx11::string::~string(local_1410);
        std::allocator<char>::~allocator((allocator<char> *)&local_1411);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_13f0);
        return local_4;
      }
      break;
    case 0x66:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_7b0,pcVar7,&local_7b1);
      bVar2 = sptk::ConvertStringToDouble
                        ((string *)CONCAT17(in_stack_ffffffffffffcb8f,in_stack_ffffffffffffcb88),
                         (double *)in_stack_ffffffffffffcb80);
      local_31e2 = !bVar2 || local_28 <= 0.0;
      std::__cxx11::string::~string(local_7b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_7b1);
      if (local_31e2) {
        std::__cxx11::ostringstream::ostringstream(local_930);
        std::operator<<((ostream *)local_930,
                        "The argument for the -f option must be a positive number");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_950,"plp",&local_951);
        sptk::PrintErrorMessage
                  ((string *)
                   CONCAT17(in_stack_ffffffffffffcd77,
                            CONCAT16(in_stack_ffffffffffffcd76,
                                     CONCAT15(in_stack_ffffffffffffcd75,
                                              CONCAT14(in_stack_ffffffffffffcd74,
                                                       in_stack_ffffffffffffcd70)))),
                   in_stack_ffffffffffffcd68);
        std::__cxx11::string::~string(local_950);
        std::allocator<char>::~allocator((allocator<char> *)&local_951);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_930);
        return local_4;
      }
      break;
    case 0x68:
      anon_unknown.dwarf_18e8::PrintUsage(in_stack_ffffffffffffcc00);
      return 0;
    case 0x6c:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_420,pcVar7,&local_421);
      bVar2 = sptk::ConvertStringToInteger
                        ((string *)CONCAT17(in_stack_ffffffffffffcb8f,in_stack_ffffffffffffcb88),
                         (int *)in_stack_ffffffffffffcb80);
      std::__cxx11::string::~string(local_420);
      std::allocator<char>::~allocator((allocator<char> *)&local_421);
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream(local_5a0);
        std::operator<<((ostream *)local_5a0,"The argument for the -l option must be an integer");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_5c0,"plp",&local_5c1);
        sptk::PrintErrorMessage
                  ((string *)
                   CONCAT17(in_stack_ffffffffffffcd77,
                            CONCAT16(in_stack_ffffffffffffcd76,
                                     CONCAT15(in_stack_ffffffffffffcd75,
                                              CONCAT14(in_stack_ffffffffffffcd74,
                                                       in_stack_ffffffffffffcd70)))),
                   in_stack_ffffffffffffcd68);
        std::__cxx11::string::~string(local_5c0);
        std::allocator<char>::~allocator((allocator<char> *)&local_5c1);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_5a0);
        return local_4;
      }
      break;
    case 0x6d:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_258,pcVar7,&local_259);
      bVar2 = sptk::ConvertStringToInteger
                        ((string *)CONCAT17(in_stack_ffffffffffffcb8f,in_stack_ffffffffffffcb88),
                         (int *)in_stack_ffffffffffffcb80);
      local_316a = !bVar2 || local_18 < 1;
      std::__cxx11::string::~string(local_258);
      std::allocator<char>::~allocator((allocator<char> *)&local_259);
      if (local_316a) {
        std::__cxx11::ostringstream::ostringstream(local_3d8);
        std::operator<<((ostream *)local_3d8,
                        "The argument for the -m option must be a positive integer");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_3f8,"plp",&local_3f9);
        sptk::PrintErrorMessage
                  ((string *)
                   CONCAT17(in_stack_ffffffffffffcd77,
                            CONCAT16(in_stack_ffffffffffffcd76,
                                     CONCAT15(in_stack_ffffffffffffcd75,
                                              CONCAT14(in_stack_ffffffffffffcd74,
                                                       in_stack_ffffffffffffcd70)))),
                   in_stack_ffffffffffffcd68);
        std::__cxx11::string::~string(local_3f8);
        std::allocator<char>::~allocator((allocator<char> *)&local_3f9);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_3d8);
        return local_4;
      }
      break;
    case 0x6e:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_80,pcVar7,&local_81);
      bVar2 = sptk::ConvertStringToInteger
                        ((string *)CONCAT17(in_stack_ffffffffffffcb8f,in_stack_ffffffffffffcb88),
                         (int *)in_stack_ffffffffffffcb80);
      local_3142 = !bVar2 || local_14 < 1;
      std::__cxx11::string::~string(local_80);
      std::allocator<char>::~allocator((allocator<char> *)&local_81);
      if (local_3142) {
        std::__cxx11::ostringstream::ostringstream(local_210);
        std::operator<<((ostream *)local_210,
                        "The argument for the -n option must be a positive integer");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_230,"plp",&local_231);
        sptk::PrintErrorMessage
                  ((string *)
                   CONCAT17(in_stack_ffffffffffffcd77,
                            CONCAT16(in_stack_ffffffffffffcd76,
                                     CONCAT15(in_stack_ffffffffffffcd75,
                                              CONCAT14(in_stack_ffffffffffffcd74,
                                                       in_stack_ffffffffffffcd70)))),
                   in_stack_ffffffffffffcd68);
        std::__cxx11::string::~string(local_230);
        std::allocator<char>::~allocator((allocator<char> *)&local_231);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_210);
        return local_4;
      }
      break;
    case 0x6f:
      local_1080 = 0;
      local_1084 = 3;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_10a8,pcVar7,&local_10a9);
      bVar2 = sptk::ConvertStringToInteger
                        ((string *)CONCAT17(in_stack_ffffffffffffcb8f,in_stack_ffffffffffffcb88),
                         (int *)in_stack_ffffffffffffcb80);
      local_32d2 = 1;
      if (bVar2) {
        bVar2 = sptk::IsInRange(local_1088,0,3);
        local_32d2 = bVar2 ^ 0xff;
      }
      std::__cxx11::string::~string(local_10a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_10a9);
      if ((local_32d2 & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream(local_1228);
        poVar5 = std::operator<<((ostream *)local_1228,
                                 "The argument for the -o option must be an integer ");
        poVar5 = std::operator<<(poVar5,"in the range of ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,0);
        poVar5 = std::operator<<(poVar5," to ");
        std::ostream::operator<<(poVar5,3);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1248,"plp",&local_1249);
        sptk::PrintErrorMessage
                  ((string *)
                   CONCAT17(in_stack_ffffffffffffcd77,
                            CONCAT16(in_stack_ffffffffffffcd76,
                                     CONCAT15(in_stack_ffffffffffffcd75,
                                              CONCAT14(in_stack_ffffffffffffcd74,
                                                       in_stack_ffffffffffffcd70)))),
                   in_stack_ffffffffffffcd68);
        std::__cxx11::string::~string(local_1248);
        std::allocator<char>::~allocator((allocator<char> *)&local_1249);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_1228);
        return local_4;
      }
      local_4c = local_1088;
      break;
    case 0x71:
      local_eb0 = 0;
      local_eb4 = 4;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_ed8,pcVar7,&local_ed9);
      in_stack_ffffffffffffcd77 =
           sptk::ConvertStringToInteger
                     ((string *)CONCAT17(in_stack_ffffffffffffcb8f,in_stack_ffffffffffffcb88),
                      (int *)in_stack_ffffffffffffcb80);
      in_stack_ffffffffffffcd74 = 1;
      if ((bool)in_stack_ffffffffffffcd77) {
        in_stack_ffffffffffffcd75 = sptk::IsInRange(local_eb8,0,4);
        in_stack_ffffffffffffcd74 = in_stack_ffffffffffffcd75 ^ 0xff;
      }
      in_stack_ffffffffffffcd76 = in_stack_ffffffffffffcd74;
      std::__cxx11::string::~string(local_ed8);
      std::allocator<char>::~allocator((allocator<char> *)&local_ed9);
      if ((in_stack_ffffffffffffcd74 & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream(local_1058);
        poVar5 = std::operator<<((ostream *)local_1058,
                                 "The argument for the -q option must be an integer ");
        poVar4 = std::operator<<(poVar5,"in the range of ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,0);
        poVar4 = std::operator<<(poVar4," to ");
        std::ostream::operator<<(poVar4,4);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1078,"plp",&local_1079);
        sptk::PrintErrorMessage
                  ((string *)
                   CONCAT17(in_stack_ffffffffffffcd77,
                            CONCAT16(in_stack_ffffffffffffcd76,
                                     CONCAT15(in_stack_ffffffffffffcd75,
                                              CONCAT14(in_stack_ffffffffffffcd74,
                                                       in_stack_ffffffffffffcd70)))),
                   (ostringstream *)poVar5);
        std::__cxx11::string::~string(local_1078);
        std::allocator<char>::~allocator((allocator<char> *)&local_1079);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_1058);
        return local_4;
      }
      local_48 = local_eb8;
      break;
    case 0x73:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_978,pcVar7,&local_979);
      bVar2 = sptk::ConvertStringToDouble
                        ((string *)CONCAT17(in_stack_ffffffffffffcb8f,in_stack_ffffffffffffcb88),
                         (double *)in_stack_ffffffffffffcb80);
      local_320a = !bVar2 || local_30 <= 0.0;
      std::__cxx11::string::~string(local_978);
      std::allocator<char>::~allocator((allocator<char> *)&local_979);
      if (local_320a) {
        std::__cxx11::ostringstream::ostringstream(local_af8);
        std::operator<<((ostream *)local_af8,
                        "The argument for the -s option must be a positive number");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_b18,"plp",&local_b19);
        sptk::PrintErrorMessage
                  ((string *)
                   CONCAT17(in_stack_ffffffffffffcd77,
                            CONCAT16(in_stack_ffffffffffffcd76,
                                     CONCAT15(in_stack_ffffffffffffcd75,
                                              CONCAT14(in_stack_ffffffffffffcd74,
                                                       in_stack_ffffffffffffcd70)))),
                   in_stack_ffffffffffffcd68);
        std::__cxx11::string::~string(local_b18);
        std::allocator<char>::~allocator((allocator<char> *)&local_b19);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_af8);
        return local_4;
      }
    }
  }
  local_1420 = local_30 * 1000.0;
  if ((local_41 & 1) == 0) {
    local_40 = local_1420 * 0.5;
  }
  else if (local_1420 * 0.5 < local_40) {
    std::__cxx11::ostringstream::ostringstream(local_1598);
    std::operator<<((ostream *)local_1598,
                    "Highest frequency must be less than or equal to Nyquist frequency");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_15b8,"plp",&local_15b9);
    sptk::PrintErrorMessage
              ((string *)
               CONCAT17(in_stack_ffffffffffffcd77,
                        CONCAT16(in_stack_ffffffffffffcd76,
                                 CONCAT15(in_stack_ffffffffffffcd75,
                                          CONCAT14(in_stack_ffffffffffffcd74,
                                                   in_stack_ffffffffffffcd70)))),
               in_stack_ffffffffffffcd68);
    std::__cxx11::string::~string(local_15b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_15b9);
    local_4 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_1598);
    return local_4;
  }
  if (local_40 <= local_38) {
    std::__cxx11::ostringstream::ostringstream(local_1738);
    std::operator<<((ostream *)local_1738,"Lowest frequency must be less than highest one");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1758,"plp",&local_1759);
    sptk::PrintErrorMessage
              ((string *)
               CONCAT17(in_stack_ffffffffffffcd77,
                        CONCAT16(in_stack_ffffffffffffcd76,
                                 CONCAT15(in_stack_ffffffffffffcd75,
                                          CONCAT14(in_stack_ffffffffffffcd74,
                                                   in_stack_ffffffffffffcd70)))),
               in_stack_ffffffffffffcd68);
    std::__cxx11::string::~string(local_1758);
    std::allocator<char>::~allocator((allocator<char> *)&local_1759);
    local_4 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_1738);
    return local_4;
  }
  local_1760 = local_8 - ya_optind;
  if (1 < local_1760) {
    poVar8 = local_18d8;
    std::__cxx11::ostringstream::ostringstream(poVar8);
    std::operator<<((ostream *)poVar8,"Too many input files");
    paVar6 = &local_18f9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_18f8,"plp",paVar6);
    sptk::PrintErrorMessage
              ((string *)
               CONCAT17(in_stack_ffffffffffffcd77,
                        CONCAT16(in_stack_ffffffffffffcd76,
                                 CONCAT15(in_stack_ffffffffffffcd75,
                                          CONCAT14(in_stack_ffffffffffffcd74,
                                                   in_stack_ffffffffffffcd70)))),
               in_stack_ffffffffffffcd68);
    std::__cxx11::string::~string(local_18f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_18f9);
    local_4 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_18d8);
    return local_4;
  }
  if (local_1760 == 0) {
    plp = (vector<double,_std::allocator<double>_> *)0x0;
  }
  else {
    plp = *(vector<double,_std::allocator<double>_> **)(local_10 + (long)ya_optind * 8);
  }
  local_1908 = plp;
  bVar2 = sptk::SetBinaryMode();
  if (!bVar2) {
    poVar8 = local_1a80;
    std::__cxx11::ostringstream::ostringstream(poVar8);
    std::operator<<((ostream *)poVar8,"Cannot set translation mode");
    paVar6 = &local_1aa1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1aa0,"plp",paVar6);
    sptk::PrintErrorMessage
              ((string *)
               CONCAT17(in_stack_ffffffffffffcd77,
                        CONCAT16(in_stack_ffffffffffffcd76,
                                 CONCAT15(in_stack_ffffffffffffcd75,
                                          CONCAT14(in_stack_ffffffffffffcd74,
                                                   in_stack_ffffffffffffcd70)))),
               in_stack_ffffffffffffcd68);
    std::__cxx11::string::~string(local_1aa0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1aa1);
    local_4 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_1a80);
    return local_4;
  }
  std::ifstream::ifstream(local_1cb0);
  pvVar1 = local_1908;
  if (local_1908 != (vector<double,_std::allocator<double>_> *)0x0) {
    std::operator|(_S_in,_S_bin);
    std::ifstream::open(local_1cb0,(_Ios_Openmode)pvVar1);
    in_stack_ffffffffffffcc77 = std::ios::fail();
    if ((in_stack_ffffffffffffcc77 & 1) != 0) {
      std::__cxx11::ostringstream::ostringstream(local_1e28);
      poVar5 = std::operator<<((ostream *)local_1e28,"Cannot open file ");
      std::operator<<(poVar5,(char *)local_1908);
      paVar6 = &local_1e49;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1e48,"plp",paVar6);
      sptk::PrintErrorMessage
                ((string *)
                 CONCAT17(in_stack_ffffffffffffcd77,
                          CONCAT16(in_stack_ffffffffffffcd76,
                                   CONCAT15(in_stack_ffffffffffffcd75,
                                            CONCAT14(in_stack_ffffffffffffcd74,
                                                     in_stack_ffffffffffffcd70)))),
                 in_stack_ffffffffffffcd68);
      std::__cxx11::string::~string(local_1e48);
      std::allocator<char>::~allocator((allocator<char> *)&local_1e49);
      local_4 = 1;
      local_1e50 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_1e28);
      goto LAB_00107c95;
    }
  }
  bVar3 = std::ifstream::is_open();
  if ((bVar3 & 1) == 0) {
    pcVar7 = (char *)&std::cin;
  }
  else {
    pcVar7 = local_1cb0;
  }
  local_1e58 = pcVar7;
  sptk::SpectrumToSpectrum::SpectrumToSpectrum
            (in_stack_ffffffffffffcc40,in_stack_ffffffffffffcc3c,in_stack_ffffffffffffcc38,
             output_format_00,(double)CONCAT17(in_stack_ffffffffffffcc2f,in_stack_ffffffffffffcc28),
             in_stack_ffffffffffffcc20);
  if ((local_48 == 4) ||
     (in_stack_ffffffffffffcc4f = sptk::SpectrumToSpectrum::IsValid(&local_1ea0),
     (bool)in_stack_ffffffffffffcc4f)) {
    sptk::WaveformToSpectrum::WaveformToSpectrum
              ((WaveformToSpectrum *)
               CONCAT17(in_stack_ffffffffffffcbd7,
                        CONCAT16(in_stack_ffffffffffffcbd6,
                                 CONCAT24(in_stack_ffffffffffffcbd4,in_stack_ffffffffffffcbd0))),
               (int)((ulong)in_stack_ffffffffffffcbc8 >> 0x20),(int)in_stack_ffffffffffffcbc8,
               (InputOutputFormats)((ulong)in_stack_ffffffffffffcbc0 >> 0x20),
               (double)CONCAT17(in_stack_ffffffffffffcbbf,in_stack_ffffffffffffcbb8),
               (double)in_stack_ffffffffffffcbb0);
    sptk::WaveformToSpectrum::Buffer::Buffer((Buffer *)0x106dbf);
    if (local_48 == 4) {
      bVar2 = sptk::WaveformToSpectrum::IsValid((WaveformToSpectrum *)0x106de0);
      in_stack_ffffffffffffcc3c = CONCAT13(bVar2,(int3)in_stack_ffffffffffffcc3c);
      if (bVar2) goto LAB_00106f49;
      std::__cxx11::ostringstream::ostringstream(local_2368);
      std::operator<<((ostream *)local_2368,"Failed to set condition for spectral analysis");
      paVar6 = &local_2389;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2388,"plp",paVar6);
      sptk::PrintErrorMessage
                ((string *)
                 CONCAT17(in_stack_ffffffffffffcd77,
                          CONCAT16(in_stack_ffffffffffffcd76,
                                   CONCAT15(in_stack_ffffffffffffcd75,
                                            CONCAT14(in_stack_ffffffffffffcd74,
                                                     in_stack_ffffffffffffcd70)))),
                 in_stack_ffffffffffffcd68);
      std::__cxx11::string::~string(local_2388);
      std::allocator<char>::~allocator((allocator<char> *)&local_2389);
      local_4 = 1;
      local_1e50 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_2368);
    }
    else {
LAB_00106f49:
      sptk::PerceptualLinearPredictiveCoefficientsAnalysis::
      PerceptualLinearPredictiveCoefficientsAnalysis
                ((PerceptualLinearPredictiveCoefficientsAnalysis *)
                 CONCAT17(in_stack_ffffffffffffcc77,in_stack_ffffffffffffcc70),
                 (int)((ulong)in_stack_ffffffffffffcc68 >> 0x20),(int)in_stack_ffffffffffffcc68,
                 (int)((ulong)in_stack_ffffffffffffcc60 >> 0x20),(int)in_stack_ffffffffffffcc60,
                 (double)CONCAT17(bVar3,in_stack_ffffffffffffcc58),(double)pcVar7,
                 (double)CONCAT17(in_stack_ffffffffffffcc4f,in_stack_ffffffffffffcc48),
                 (double)in_stack_ffffffffffffcc40,
                 (double)CONCAT44(in_stack_ffffffffffffcc3c,in_stack_ffffffffffffcc38));
      sptk::PerceptualLinearPredictiveCoefficientsAnalysis::Buffer::Buffer
                (in_stack_ffffffffffffcbc0);
      bVar2 = sptk::PerceptualLinearPredictiveCoefficientsAnalysis::IsValid(&local_2488);
      if (bVar2) {
        if (local_48 == 4) {
          local_33e4 = local_1c;
        }
        else {
          local_33e4 = local_1c / 2 + 1;
        }
        local_2768._112_4_ = local_33e4;
        local_2768._108_4_ = local_18;
        std::allocator<double>::allocator((allocator<double> *)0x10719f);
        std::vector<double,_std::allocator<double>_>::vector
                  (in_stack_ffffffffffffcba0,
                   CONCAT17(in_stack_ffffffffffffcb9f,in_stack_ffffffffffffcb98),
                   (allocator_type *)in_stack_ffffffffffffcb90);
        std::allocator<double>::~allocator((allocator<double> *)0x1071cb);
        std::allocator<double>::allocator((allocator<double> *)0x1071fc);
        std::vector<double,_std::allocator<double>_>::vector
                  (in_stack_ffffffffffffcba0,
                   CONCAT17(in_stack_ffffffffffffcb9f,in_stack_ffffffffffffcb98),
                   (allocator_type *)in_stack_ffffffffffffcb90);
        std::allocator<double>::~allocator((allocator<double> *)0x107228);
        std::allocator<double>::allocator((allocator<double> *)0x107247);
        std::vector<double,_std::allocator<double>_>::vector
                  (in_stack_ffffffffffffcba0,
                   CONCAT17(in_stack_ffffffffffffcb9f,in_stack_ffffffffffffcb98),
                   (allocator_type *)in_stack_ffffffffffffcb90);
        std::allocator<double>::~allocator((allocator<double> *)0x10726d);
        local_2768._0_8_ = (_func_int **)0x0;
        do {
          buffer = (Buffer *)0x0;
          in_stack_ffffffffffffcbe7 =
               sptk::ReadStream<double>
                         ((bool)in_stack_ffffffffffffcbd6,in_stack_ffffffffffffcbd0,
                          (int)((ulong)in_stack_ffffffffffffcbc8 >> 0x20),
                          (int)in_stack_ffffffffffffcbc8,
                          (vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffcbc0,
                          (istream *)CONCAT17(in_stack_ffffffffffffcbbf,in_stack_ffffffffffffcbb8),
                          (int *)CONCAT17(in_stack_ffffffffffffcbe7,
                                          CONCAT16(in_stack_ffffffffffffcbe6,
                                                   in_stack_ffffffffffffcbe0)));
          if (!(bool)in_stack_ffffffffffffcbe7) {
            local_4 = 0;
            local_1e50 = 1;
            goto LAB_00107bb5;
          }
          if (local_48 == 4) {
            bVar2 = sptk::WaveformToSpectrum::Run
                              (in_stack_ffffffffffffcb90,
                               (vector<double,_std::allocator<double>_> *)
                               CONCAT17(in_stack_ffffffffffffcb8f,in_stack_ffffffffffffcb88),
                               (vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffcb80,
                               buffer);
            if (!bVar2) {
              std::__cxx11::ostringstream::ostringstream(local_2a80);
              std::operator<<((ostream *)local_2a80,"Failed to transform waveform to spectrum");
              paVar6 = &local_2aa1;
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_2aa0,"plp",paVar6);
              sptk::PrintErrorMessage
                        ((string *)
                         CONCAT17(in_stack_ffffffffffffcd77,
                                  CONCAT16(in_stack_ffffffffffffcd76,
                                           CONCAT15(in_stack_ffffffffffffcd75,
                                                    CONCAT14(in_stack_ffffffffffffcd74,
                                                             in_stack_ffffffffffffcd70)))),
                         in_stack_ffffffffffffcd68);
              std::__cxx11::string::~string(local_2aa0);
              std::allocator<char>::~allocator((allocator<char> *)&local_2aa1);
              local_4 = 1;
              local_1e50 = 1;
              std::__cxx11::ostringstream::~ostringstream(local_2a80);
              goto LAB_00107bb5;
            }
          }
          else {
            in_stack_ffffffffffffcbe6 =
                 sptk::SpectrumToSpectrum::Run
                           (in_stack_ffffffffffffcbc8,
                            (vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffcbc0,
                            (vector<double,_std::allocator<double>_> *)
                            CONCAT17(in_stack_ffffffffffffcbbf,in_stack_ffffffffffffcbb8));
            if (!(bool)in_stack_ffffffffffffcbe6) {
              std::__cxx11::ostringstream::ostringstream(local_28e0);
              std::operator<<((ostream *)local_28e0,"Failed to convert spectrum");
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_2900,"plp",&local_2901);
              sptk::PrintErrorMessage
                        ((string *)
                         CONCAT17(in_stack_ffffffffffffcd77,
                                  CONCAT16(in_stack_ffffffffffffcd76,
                                           CONCAT15(in_stack_ffffffffffffcd75,
                                                    CONCAT14(in_stack_ffffffffffffcd74,
                                                             in_stack_ffffffffffffcd70)))),
                         in_stack_ffffffffffffcd68);
              std::__cxx11::string::~string(local_2900);
              std::allocator<char>::~allocator((allocator<char> *)&local_2901);
              local_4 = 1;
              local_1e50 = 1;
              std::__cxx11::ostringstream::~ostringstream(local_28e0);
              goto LAB_00107bb5;
            }
          }
          if ((local_4c == 1) || (local_4c == 3)) {
            in_stack_ffffffffffffcbc0 = (Buffer *)local_2768;
          }
          else {
            in_stack_ffffffffffffcbc0 = (Buffer *)0x0;
          }
          in_stack_ffffffffffffcbbf =
               sptk::PerceptualLinearPredictiveCoefficientsAnalysis::Run
                         (in_stack_ffffffffffffcca8,in_stack_ffffffffffffcca0,plp,
                          in_stack_ffffffffffffcc90,in_stack_ffffffffffffcc88);
          if (!(bool)in_stack_ffffffffffffcbbf) {
            std::__cxx11::ostringstream::ostringstream(local_2c20);
            std::operator<<((ostream *)local_2c20,"Failed to run PLP analysis");
            paVar6 = &local_2c41;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_2c40,"plp",paVar6);
            sptk::PrintErrorMessage
                      ((string *)
                       CONCAT17(in_stack_ffffffffffffcd77,
                                CONCAT16(in_stack_ffffffffffffcd76,
                                         CONCAT15(in_stack_ffffffffffffcd75,
                                                  CONCAT14(in_stack_ffffffffffffcd74,
                                                           in_stack_ffffffffffffcd70)))),
                       in_stack_ffffffffffffcd68);
            std::__cxx11::string::~string(local_2c40);
            std::allocator<char>::~allocator((allocator<char> *)&local_2c41);
            local_4 = 1;
            local_1e50 = 1;
            std::__cxx11::ostringstream::~ostringstream(local_2c20);
            goto LAB_00107bb5;
          }
          bVar2 = sptk::WriteStream<double>
                            (in_stack_ffffffffffffcbd0,
                             (int)((ulong)in_stack_ffffffffffffcbc8 >> 0x20),
                             (vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffcbc0,
                             (ostream *)
                             CONCAT17(in_stack_ffffffffffffcbbf,in_stack_ffffffffffffcbb8),
                             in_stack_ffffffffffffcbb0);
          if (!bVar2) {
            std::__cxx11::ostringstream::ostringstream(local_2dc0);
            std::operator<<((ostream *)local_2dc0,"Failed to write PLP");
            paVar6 = &local_2de1;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_2de0,"plp",paVar6);
            sptk::PrintErrorMessage
                      ((string *)
                       CONCAT17(in_stack_ffffffffffffcd77,
                                CONCAT16(in_stack_ffffffffffffcd76,
                                         CONCAT15(in_stack_ffffffffffffcd75,
                                                  CONCAT14(in_stack_ffffffffffffcd74,
                                                           in_stack_ffffffffffffcd70)))),
                       in_stack_ffffffffffffcd68);
            std::__cxx11::string::~string(local_2de0);
            std::allocator<char>::~allocator((allocator<char> *)&local_2de1);
            local_4 = 1;
            local_1e50 = 1;
            std::__cxx11::ostringstream::~ostringstream(local_2dc0);
            goto LAB_00107bb5;
          }
          if ((local_4c == 2) || (local_4c == 3)) {
            std::vector<double,_std::allocator<double>_>::operator[]
                      ((vector<double,_std::allocator<double>_> *)(local_2768 + 0x10),0);
            bVar2 = sptk::WriteStream<double>((double)buffer,(ostream *)0x10790e);
            if (!bVar2) {
              std::__cxx11::ostringstream::ostringstream(local_2f60);
              std::operator<<((ostream *)local_2f60,"Failed to write c0");
              in_stack_ffffffffffffcb90 = (WaveformToSpectrum *)local_2f81;
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)(local_2f81 + 1),"plp",(allocator *)in_stack_ffffffffffffcb90);
              sptk::PrintErrorMessage
                        ((string *)
                         CONCAT17(in_stack_ffffffffffffcd77,
                                  CONCAT16(in_stack_ffffffffffffcd76,
                                           CONCAT15(in_stack_ffffffffffffcd75,
                                                    CONCAT14(in_stack_ffffffffffffcd74,
                                                             in_stack_ffffffffffffcd70)))),
                         in_stack_ffffffffffffcd68);
              std::__cxx11::string::~string((string *)(local_2f81 + 1));
              std::allocator<char>::~allocator((allocator<char> *)local_2f81);
              local_4 = 1;
              local_1e50 = 1;
              std::__cxx11::ostringstream::~ostringstream(local_2f60);
              goto LAB_00107bb5;
            }
          }
        } while (((local_4c != 1) && (local_4c != 3)) ||
                (in_stack_ffffffffffffcb8f =
                      sptk::WriteStream<double>((double)buffer,(ostream *)0x107a70),
                (bool)in_stack_ffffffffffffcb8f));
        std::__cxx11::ostringstream::ostringstream(local_3100);
        std::operator<<((ostream *)local_3100,"Failed to write energy");
        in_stack_ffffffffffffcb80 = (PerceptualLinearPredictiveCoefficientsAnalysis *)local_3121;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)(local_3121 + 1),"plp",(allocator *)in_stack_ffffffffffffcb80);
        sptk::PrintErrorMessage
                  ((string *)
                   CONCAT17(in_stack_ffffffffffffcd77,
                            CONCAT16(in_stack_ffffffffffffcd76,
                                     CONCAT15(in_stack_ffffffffffffcd75,
                                              CONCAT14(in_stack_ffffffffffffcd74,
                                                       in_stack_ffffffffffffcd70)))),
                   in_stack_ffffffffffffcd68);
        std::__cxx11::string::~string((string *)(local_3121 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_3121);
        local_4 = 1;
        local_1e50 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_3100);
LAB_00107bb5:
        std::vector<double,_std::allocator<double>_>::~vector
                  ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffcb90);
        std::vector<double,_std::allocator<double>_>::~vector
                  ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffcb90);
        std::vector<double,_std::allocator<double>_>::~vector
                  ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffcb90);
      }
      else {
        std::__cxx11::ostringstream::ostringstream(local_26d0);
        std::operator<<((ostream *)local_26d0,"Failed to set condition for PLP analysis");
        paVar6 = (allocator *)(local_2768 + 0x77);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_26f0,"plp",paVar6);
        sptk::PrintErrorMessage
                  ((string *)
                   CONCAT17(in_stack_ffffffffffffcd77,
                            CONCAT16(in_stack_ffffffffffffcd76,
                                     CONCAT15(in_stack_ffffffffffffcd75,
                                              CONCAT14(in_stack_ffffffffffffcd74,
                                                       in_stack_ffffffffffffcd70)))),
                   in_stack_ffffffffffffcd68);
        std::__cxx11::string::~string(local_26f0);
        std::allocator<char>::~allocator((allocator<char> *)(local_2768 + 0x77));
        local_4 = 1;
        local_1e50 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_26d0);
      }
      sptk::PerceptualLinearPredictiveCoefficientsAnalysis::Buffer::~Buffer
                ((Buffer *)in_stack_ffffffffffffcb80);
      sptk::PerceptualLinearPredictiveCoefficientsAnalysis::
      ~PerceptualLinearPredictiveCoefficientsAnalysis(in_stack_ffffffffffffcb80);
    }
    sptk::WaveformToSpectrum::Buffer::~Buffer((Buffer *)0x107c4c);
    sptk::WaveformToSpectrum::~WaveformToSpectrum((WaveformToSpectrum *)in_stack_ffffffffffffcb80);
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_2018);
    std::operator<<((ostream *)local_2018,"Failed to set condition for input formatting");
    paVar6 = &local_2039;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2038,"plp",paVar6);
    sptk::PrintErrorMessage
              ((string *)
               CONCAT17(in_stack_ffffffffffffcd77,
                        CONCAT16(in_stack_ffffffffffffcd76,
                                 CONCAT15(in_stack_ffffffffffffcd75,
                                          CONCAT14(in_stack_ffffffffffffcd74,
                                                   in_stack_ffffffffffffcd70)))),
               in_stack_ffffffffffffcd68);
    std::__cxx11::string::~string(local_2038);
    std::allocator<char>::~allocator((allocator<char> *)&local_2039);
    local_4 = 1;
    local_1e50 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_2018);
  }
  sptk::SpectrumToSpectrum::~SpectrumToSpectrum((SpectrumToSpectrum *)in_stack_ffffffffffffcb90);
LAB_00107c95:
  std::ifstream::~ifstream(local_1cb0);
  return local_4;
}

Assistant:

int main(int argc, char* argv[]) {
  int num_channel(kDefaultNumChannel);
  int num_order(kDefaultNumOrder);
  int fft_length(kDefaultFftLength);
  int liftering_coefficient(kDefaultLifteringCoefficient);
  double compression_factor(kDefaultCompressionFactor);
  double sampling_rate(kDefaultSamplingRate);
  double lowest_frequency(kDefaultLowestFrequency);
  double highest_frequency(0.0);
  bool is_highest_frequency_specified(false);
  InputFormats input_format(kDefaultInputFormat);
  OutputFormats output_format(kDefaultOutputFormat);
  double floor(kDefaultFloor);

  for (;;) {
    const int option_char(
        getopt_long(argc, argv, "n:m:l:c:f:s:L:H:q:o:e:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'n': {
        if (!sptk::ConvertStringToInteger(optarg, &num_channel) ||
            num_channel <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -n option must be a positive integer";
          sptk::PrintErrorMessage("plp", error_message);
          return 1;
        }
        break;
      }
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &num_order) ||
            num_order <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -m option must be a positive integer";
          sptk::PrintErrorMessage("plp", error_message);
          return 1;
        }
        break;
      }
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &fft_length)) {
          std::ostringstream error_message;
          error_message << "The argument for the -l option must be an integer";
          sptk::PrintErrorMessage("plp", error_message);
          return 1;
        }
        break;
      }
      case 'c': {
        if (!sptk::ConvertStringToInteger(optarg, &liftering_coefficient) ||
            liftering_coefficient <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -c option must be a positive integer";
          sptk::PrintErrorMessage("plp", error_message);
          return 1;
        }
        break;
      }
      case 'f': {
        if (!sptk::ConvertStringToDouble(optarg, &compression_factor) ||
            compression_factor <= 0.0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -f option must be a positive number";
          sptk::PrintErrorMessage("plp", error_message);
          return 1;
        }
        break;
      }
      case 's': {
        if (!sptk::ConvertStringToDouble(optarg, &sampling_rate) ||
            sampling_rate <= 0.0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -s option must be a positive number";
          sptk::PrintErrorMessage("plp", error_message);
          return 1;
        }
        break;
      }
      case 'L': {
        if (!sptk::ConvertStringToDouble(optarg, &lowest_frequency) ||
            lowest_frequency < 0.0) {
          std::ostringstream error_message;
          error_message << "The argument for the -L option must be a "
                        << "non-negative number";
          sptk::PrintErrorMessage("plp", error_message);
          return 1;
        }
        break;
      }
      case 'H': {
        if (!sptk::ConvertStringToDouble(optarg, &highest_frequency) ||
            highest_frequency <= 0.0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -H option must be a positive number";
          sptk::PrintErrorMessage("plp", error_message);
          return 1;
        }
        is_highest_frequency_specified = true;
        break;
      }
      case 'q': {
        const int min(0);
        const int max(static_cast<int>(kNumInputFormats) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -q option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("plp", error_message);
          return 1;
        }
        input_format = static_cast<InputFormats>(tmp);
        break;
      }
      case 'o': {
        const int min(0);
        const int max(static_cast<int>(kNumOutputFormats) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -o option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("plp", error_message);
          return 1;
        }
        output_format = static_cast<OutputFormats>(tmp);
        break;
      }
      case 'e': {
        if (!sptk::ConvertStringToDouble(optarg, &floor) || floor <= 0.0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -e option must be a positive number";
          sptk::PrintErrorMessage("plp", error_message);
          return 1;
        }
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const double sampling_rate_in_hz(1000.0 * sampling_rate);
  if (!is_highest_frequency_specified) {
    highest_frequency = 0.5 * sampling_rate_in_hz;
  } else if (0.5 * sampling_rate_in_hz < highest_frequency) {
    std::ostringstream error_message;
    error_message
        << "Highest frequency must be less than or equal to Nyquist frequency";
    sptk::PrintErrorMessage("plp", error_message);
    return 1;
  }

  if (highest_frequency <= lowest_frequency) {
    std::ostringstream error_message;
    error_message << "Lowest frequency must be less than highest one";
    sptk::PrintErrorMessage("plp", error_message);
    return 1;
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("plp", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("plp", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("plp", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  sptk::SpectrumToSpectrum spectrum_to_spectrum(
      fft_length,
      static_cast<sptk::SpectrumToSpectrum::InputOutputFormats>(input_format),
      sptk::SpectrumToSpectrum::InputOutputFormats::kPowerSpectrum);
  if (kWaveform != input_format && !spectrum_to_spectrum.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to set condition for input formatting";
    sptk::PrintErrorMessage("plp", error_message);
    return 1;
  }

  sptk::WaveformToSpectrum waveform_to_spectrum(
      fft_length, fft_length,
      sptk::SpectrumToSpectrum::InputOutputFormats::kPowerSpectrum);
  sptk::WaveformToSpectrum::Buffer buffer_for_spectral_analysis;
  if (kWaveform == input_format && !waveform_to_spectrum.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to set condition for spectral analysis";
    sptk::PrintErrorMessage("plp", error_message);
    return 1;
  }

  sptk::PerceptualLinearPredictiveCoefficientsAnalysis analysis(
      fft_length, num_channel, num_order, liftering_coefficient,
      compression_factor, sampling_rate_in_hz, lowest_frequency,
      highest_frequency, floor);
  sptk::PerceptualLinearPredictiveCoefficientsAnalysis::Buffer
      buffer_for_plp_analysis;
  if (!analysis.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to set condition for PLP analysis";
    sptk::PrintErrorMessage("plp", error_message);
    return 1;
  }

  const int input_length(kWaveform == input_format ? fft_length
                                                   : fft_length / 2 + 1);
  const int output_length(num_order);
  std::vector<double> input(input_length);
  std::vector<double> processed_input(fft_length / 2 + 1);
  std::vector<double> output(output_length);
  double energy(0.0);

  while (sptk::ReadStream(false, 0, 0, input_length, &input, &input_stream,
                          NULL)) {
    if (kWaveform != input_format) {
      if (!spectrum_to_spectrum.Run(input, &processed_input)) {
        std::ostringstream error_message;
        error_message << "Failed to convert spectrum";
        sptk::PrintErrorMessage("plp", error_message);
        return 1;
      }
    } else {
      if (!waveform_to_spectrum.Run(input, &processed_input,
                                    &buffer_for_spectral_analysis)) {
        std::ostringstream error_message;
        error_message << "Failed to transform waveform to spectrum";
        sptk::PrintErrorMessage("plp", error_message);
        return 1;
      }
    }

    if (!analysis.Run(processed_input, &output,
                      (kPlpAndEnergy == output_format ||
                       kPlpAndC0AndEnergy == output_format)
                          ? &energy
                          : NULL,
                      &buffer_for_plp_analysis)) {
      std::ostringstream error_message;
      error_message << "Failed to run PLP analysis";
      sptk::PrintErrorMessage("plp", error_message);
      return 1;
    }

    if (!sptk::WriteStream(1, output_length, output, &std::cout, NULL)) {
      std::ostringstream error_message;
      error_message << "Failed to write PLP";
      sptk::PrintErrorMessage("plp", error_message);
      return 1;
    }

    if (kPlpAndC0 == output_format || kPlpAndC0AndEnergy == output_format) {
      if (!sptk::WriteStream(output[0], &std::cout)) {
        std::ostringstream error_message;
        error_message << "Failed to write c0";
        sptk::PrintErrorMessage("plp", error_message);
        return 1;
      }
    }

    if (kPlpAndEnergy == output_format || kPlpAndC0AndEnergy == output_format) {
      if (!sptk::WriteStream(energy, &std::cout)) {
        std::ostringstream error_message;
        error_message << "Failed to write energy";
        sptk::PrintErrorMessage("plp", error_message);
        return 1;
      }
    }
  }

  return 0;
}